

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O0

void printUsage(char **argv,int idx)

{
  ostream *poVar1;
  int in_ESI;
  undefined8 *in_RDI;
  char *usage;
  
  if (in_ESI < 1) {
    std::operator<<((ostream *)&std::cerr,"missing input file\n\n");
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"invalid option \"");
    poVar1 = std::operator<<(poVar1,(char *)in_RDI[in_ESI]);
    std::operator<<(poVar1,"\"\n\n");
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"usage: ");
  poVar1 = std::operator<<(poVar1,(char *)*in_RDI);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"[options] <lpfile>\n");
  poVar1 = std::operator<<(poVar1,
                           "  <lpfile>               linear program as .mps[.gz] or .lp[.gz] file\n\n"
                          );
  std::operator<<(poVar1,
                  "general options:\n  --readbas=<basfile>    read starting basis from file\n  --writebas=<basfile>   write terminal basis to file\n  --writefile=<lpfile>   write LP to file in LP or MPS format depending on extension\n  --writedual=<lpfile>   write the dual LP to a file in LP or MPS formal depending on extension\n  --<type>:<name>=<val>  change parameter value using syntax of settings file entries\n  --loadset=<setfile>    load parameters from settings file (overruled by command line parameters)\n  --saveset=<setfile>    save parameters to settings file\n  --diffset=<setfile>    save modified parameters to settings file\n  --extsol=<value>       external solution for soplex to use for validation\n\nlimits and tolerances:\n  -t<s>                  set time limit to <s> seconds\n  -i<n>                  set iteration limit to <n>\n  -f<eps>                set primal feasibility tolerance to <eps>\n  -o<eps>                set dual feasibility (optimality) tolerance to <eps>\n  -l<eps>                set validation tolerance to <eps>\n\nalgorithmic settings (* indicates default):\n  --readmode=<value>     choose reading mode for <lpfile> (0* - floating-point, 1 - rational)\n  --solvemode=<value>    choose solving mode (0 - floating-point solve, 1* - auto, 2 - exact rational solve)\n  --arithmetic=<value>   choose base arithmetic type (0 - double, 1 - quadprecision, 2 - higher multiprecision)\n  --precision=<value>    choose precision for multiprecision solve (only active when arithmetic=2, possible values 50,100,200, compile with mpfr for arbitrary precision)\n  -s<value>              choose simplifier/presolver (0 - off, 1* - internal, 2*- PaPILO)\n  -g<value>              choose scaling (0 - off, 1 - uni-equilibrium, 2* - bi-equilibrium, 3 - geometric, 4 - iterated geometric, 5 - least squares, 6 - geometric-equilibrium)\n  -p<value>              choose pricing (0* - auto, 1 - dantzig, 2 - parmult, 3 - devex, 4 - quicksteep, 5 - steep)\n  -r<value>              choose ratio tester (0 - textbook, 1 - harris, 2 - fast, 3* - boundflipping)\n\ndisp..." /* TRUNCATED STRING LITERAL */
                 );
  return;
}

Assistant:

static
void printUsage(const char* const argv[], int idx)
{
   const char* usage =
      "general options:\n"
      "  --readbas=<basfile>    read starting basis from file\n"
      "  --writebas=<basfile>   write terminal basis to file\n"
      "  --writefile=<lpfile>   write LP to file in LP or MPS format depending on extension\n"
      "  --writedual=<lpfile>   write the dual LP to a file in LP or MPS formal depending on extension\n"
      "  --<type>:<name>=<val>  change parameter value using syntax of settings file entries\n"
      "  --loadset=<setfile>    load parameters from settings file (overruled by command line parameters)\n"
      "  --saveset=<setfile>    save parameters to settings file\n"
      "  --diffset=<setfile>    save modified parameters to settings file\n"
      "  --extsol=<value>       external solution for soplex to use for validation\n"
      "\n"
      "limits and tolerances:\n"
      "  -t<s>                  set time limit to <s> seconds\n"
      "  -i<n>                  set iteration limit to <n>\n"
      "  -f<eps>                set primal feasibility tolerance to <eps>\n"
      "  -o<eps>                set dual feasibility (optimality) tolerance to <eps>\n"
      "  -l<eps>                set validation tolerance to <eps>\n"
      "\n"
      "algorithmic settings (* indicates default):\n"
      "  --readmode=<value>     choose reading mode for <lpfile> (0* - floating-point, 1 - rational)\n"
      "  --solvemode=<value>    choose solving mode (0 - floating-point solve, 1* - auto, 2 - exact rational solve)\n"
      "  --arithmetic=<value>   choose base arithmetic type (0 - double, 1 - quadprecision, 2 - higher multiprecision)\n"
#ifdef SOPLEX_WITH_MPFR
      "  --precision=<value>    choose precision for multiprecision solve (only active when arithmetic=2 minimal value = 50)\n"
#endif
#ifdef SOPLEX_WITH_CPPMPF
      "  --precision=<value>    choose precision for multiprecision solve (only active when arithmetic=2, possible values 50,100,200, compile with mpfr for arbitrary precision)\n"
#endif
      "  -s<value>              choose simplifier/presolver (0 - off, 1* - internal, 2*- PaPILO)\n"
      "  -g<value>              choose scaling (0 - off, 1 - uni-equilibrium, 2* - bi-equilibrium, 3 - geometric, 4 - iterated geometric, 5 - least squares, 6 - geometric-equilibrium)\n"
      "  -p<value>              choose pricing (0* - auto, 1 - dantzig, 2 - parmult, 3 - devex, 4 - quicksteep, 5 - steep)\n"
      "  -r<value>              choose ratio tester (0 - textbook, 1 - harris, 2 - fast, 3* - boundflipping)\n"
      "\n"
      "display options:\n"
      "  -v<level>              set verbosity to <level> (0 - error, 3 - normal, 5 - high)\n"
      "  -x=<solfile>           print primal solution to file (or just -x to print to terminal)\n"
      "  -y=<solfile>           print dual multipliers to file (or just -y to print to terminal)\n"
      "  -X=<solfile>           print primal solution in rational numbers to file (or just -X to print to terminal)\n"
      "  -Y=<solfile>           print dual multipliers in rational numbers to file (or just -Y to print to terminal)\n"
      "  -q                     display detailed statistics\n"
      "  -c                     perform final check of optimal solution in original problem\n"
      "\n";

   if(idx <= 0)
      std::cerr << "missing input file\n\n";
   else
      std::cerr << "invalid option \"" << argv[idx] << "\"\n\n";

   std::cerr << "usage: " << argv[0] << " " << "[options] <lpfile>\n"
#ifdef SOPLEX_WITH_ZLIB
             << "  <lpfile>               linear program as .mps[.gz] or .lp[.gz] file\n\n"
#else
             << "  <lpfile>               linear program as .mps or .lp file\n\n"
#endif
             << usage;
}